

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O3

void Saig_ManDupIsoCanonical_rec(Aig_Man_t *pNew,Aig_Man_t *pAig,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  ulong uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  
  if (pObj->TravId != pAig->nTravIds) {
    pObj->TravId = pAig->nTravIds;
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIso.c"
                    ,0x5e,"void Saig_ManDupIsoCanonical_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)")
      ;
    }
    pAVar3 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (((*(uint *)&pAVar3->field_0x18 & 7) - 7 < 0xfffffffe) ||
       (pAVar1 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),
       (*(uint *)&pAVar1->field_0x18 & 7) - 7 < 0xfffffffe)) {
      Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar3);
      ppAVar4 = &pObj->pFanin1;
    }
    else {
      if ((pAVar3->field_5).iData == (pAVar1->field_5).iData) {
        __assert_fail("Aig_ObjFanin0(pObj)->iData != Aig_ObjFanin1(pObj)->iData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIso.c"
                      ,0x66,
                      "void Saig_ManDupIsoCanonical_rec(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *)");
      }
      if ((pAVar3->field_5).iData < (pAVar1->field_5).iData) {
        Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar3);
        ppAVar4 = &pObj->pFanin1;
      }
      else {
        Saig_ManDupIsoCanonical_rec(pNew,pAig,pAVar1);
        ppAVar4 = &pObj->pFanin0;
      }
    }
    Saig_ManDupIsoCanonical_rec(pNew,pAig,(Aig_Obj_t *)((ulong)*ppAVar4 & 0xfffffffffffffffe));
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                    ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
    }
    pAVar3 = pObj->pFanin0;
    uVar2 = (ulong)pAVar3 & 0xfffffffffffffffe;
    if (uVar2 == 0) {
      pAVar3 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar3 = (Aig_Obj_t *)((ulong)((uint)pAVar3 & 1) ^ *(ulong *)(uVar2 + 0x28));
    }
    uVar2 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
    if (uVar2 == 0) {
      pAVar1 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar2 + 0x28));
    }
    pAVar3 = Aig_And(pNew,pAVar3,pAVar1);
    (pObj->field_5).pData = pAVar3;
  }
  return;
}

Assistant:

void Saig_ManDupIsoCanonical_rec( Aig_Man_t * pNew, Aig_Man_t * pAig, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    assert( Aig_ObjIsNode(pObj) );
    if ( !Aig_ObjIsNode(Aig_ObjFanin0(pObj)) || !Aig_ObjIsNode(Aig_ObjFanin1(pObj)) )
    {
        Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
        Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin1(pObj) );
    }
    else
    {
        assert( Aig_ObjFanin0(pObj)->iData != Aig_ObjFanin1(pObj)->iData );
        if ( Aig_ObjFanin0(pObj)->iData < Aig_ObjFanin1(pObj)->iData )
        {
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin1(pObj) );
        }
        else
        {
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin1(pObj) );
            Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
        }
    }
    pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
}